

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

gdImagePtr gdImageNeuQuant(gdImagePtr im,int max_color,int sample_factor)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  byte *ptr;
  long lVar4;
  nn_quant *nnq;
  int *piVar5;
  gdImagePtr pgVar6;
  byte *pbVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  bool bVar15;
  uchar map [256] [4];
  int remap [256];
  long local_850;
  byte local_838 [1024];
  byte abStack_438 [1032];
  
  iVar9 = 3;
  if (0 < sample_factor) {
    iVar9 = sample_factor;
  }
  iVar2 = overflow2(im->sx,im->sy);
  if (((iVar2 == 0) && (iVar2 = overflow2(im->sy * im->sx,4), iVar2 == 0)) &&
     (ptr = (byte *)gdMalloc((long)(im->sx * im->sy * 4)), ptr != (byte *)0x0)) {
    if (0 < im->sy) {
      lVar4 = 0;
      pbVar7 = ptr;
      do {
        if (0 < im->sx) {
          piVar5 = im->tpixels[lVar4];
          iVar2 = 0;
          do {
            iVar13 = *piVar5;
            if (im->trueColor == 0) {
              bVar11 = (byte)im->alpha[iVar13];
            }
            else {
              bVar11 = (byte)((uint)iVar13 >> 0x18) & 0x7f;
            }
            *pbVar7 = bVar11;
            if (im->trueColor == 0) {
              bVar11 = (byte)im->red[iVar13];
            }
            else {
              bVar11 = (byte)((uint)iVar13 >> 0x10);
            }
            pbVar7[1] = bVar11;
            iVar12 = iVar13;
            if (im->trueColor == 0) {
              iVar12 = im->blue[iVar13];
            }
            pbVar7[2] = (byte)iVar12;
            if (im->trueColor == 0) {
              bVar11 = (byte)im->green[iVar13];
            }
            else {
              bVar11 = (byte)((uint)iVar13 >> 8);
            }
            pbVar7[3] = bVar11;
            pbVar7 = pbVar7 + 4;
            piVar5 = piVar5 + 1;
            iVar2 = iVar2 + 1;
          } while (iVar2 < im->sx);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < im->sy);
    }
    nnq = (nn_quant *)gdMalloc(0x2098);
    if (nnq == (nn_quant *)0x0) {
      nnq = (nn_quant *)0x0;
    }
    else {
      iVar2 = im->sy;
      iVar13 = im->sx;
      memset(nnq->network,0,0x1400);
      nnq->thepicture = ptr;
      nnq->lengthcount = iVar2 * iVar13 * 4;
      nnq->samplefac = iVar9;
      nnq->netsize = max_color;
      if (0 < max_color) {
        uVar8 = 0;
        piVar5 = nnq->freq;
        piVar14 = nnq->network[0] + 3;
        do {
          iVar9 = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                       (long)max_color);
          *piVar14 = iVar9;
          piVar14[-1] = iVar9;
          piVar14[-2] = iVar9;
          (*(nq_pixel *)(piVar14 + -3))[0] = iVar9;
          *piVar5 = (int)(0x10000 / (ulong)(uint)max_color);
          piVar5[-0x100] = 0;
          uVar8 = uVar8 + 0x1000;
          piVar5 = piVar5 + 1;
          piVar14 = piVar14 + 5;
        } while ((ulong)(uint)max_color << 0xc != uVar8);
      }
      learn(nnq,1);
      unbiasnet(nnq);
      if (0 < nnq->netsize) {
        piVar5 = nnq->network[0] + 3;
        pbVar7 = local_838;
        lVar4 = 0;
        do {
          lVar10 = 0;
          do {
            *pbVar7 = *(byte *)((long)piVar5 + lVar10);
            pbVar7 = pbVar7 + 1;
            lVar10 = lVar10 + -4;
          } while (lVar10 != -0x10);
          lVar4 = lVar4 + 1;
          piVar5 = piVar5 + 5;
        } while (lVar4 < nnq->netsize);
      }
      inxbuild(nnq);
      iVar9 = max_color + -1;
      if (max_color < 1) {
        iVar2 = 0;
      }
      else {
        uVar8 = 0;
        iVar2 = 0;
        do {
          bVar15 = abStack_438[uVar8 * 4 + -0x3fd] == 0xff;
          iVar13 = iVar2;
          if (bVar15) {
            iVar13 = iVar9;
          }
          iVar9 = iVar9 - (uint)bVar15;
          iVar2 = iVar2 + (uint)!bVar15;
          *(int *)(abStack_438 + uVar8 * 4) = iVar13;
          uVar8 = uVar8 + 1;
        } while ((uint)max_color != uVar8);
      }
      if (iVar2 != iVar9 + 1) {
        pgVar6 = (gdImagePtr)0x0;
        gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n");
        goto LAB_0011e11e;
      }
      pgVar6 = gdImageCreate(im->sx,im->sy);
      if (pgVar6 != (gdImagePtr)0x0) {
        if (0 < max_color) {
          uVar8 = 0;
          do {
            iVar9 = *(int *)(abStack_438 + uVar8 * 4);
            pgVar6->red[iVar9] = (uint)abStack_438[(uVar8 - 0x100) * 4];
            pgVar6->green[iVar9] = (uint)abStack_438[uVar8 * 4 + -0x3ff];
            pgVar6->blue[iVar9] = (uint)abStack_438[uVar8 * 4 + -0x3fe];
            pgVar6->alpha[iVar9] = (uint)abStack_438[uVar8 * 4 + -0x3fd];
            pgVar6->open[iVar9] = 0;
            pgVar6->colorsTotal = pgVar6->colorsTotal + 1;
            uVar8 = uVar8 + 1;
          } while ((uint)max_color != uVar8);
        }
        if (0 < im->sy) {
          iVar9 = 0;
          local_850 = 0;
          do {
            if (0 < im->sx) {
              puVar1 = pgVar6->pixels[local_850];
              iVar2 = im->sx * iVar9;
              lVar4 = 0;
              do {
                uVar3 = inxsearch(nnq,(uint)ptr[iVar2],(uint)ptr[iVar2 + 2],(uint)ptr[iVar2 + 3],
                                  (uint)ptr[iVar2 + 1]);
                puVar1[lVar4] = abStack_438[(ulong)uVar3 * 4];
                lVar4 = lVar4 + 1;
                iVar2 = iVar2 + 4;
              } while (lVar4 < im->sx);
            }
            local_850 = local_850 + 1;
            iVar9 = iVar9 + 4;
          } while (local_850 < im->sy);
        }
        goto LAB_0011e11e;
      }
    }
  }
  else {
    nnq = (nn_quant *)0x0;
    ptr = (byte *)0x0;
  }
  pgVar6 = (gdImagePtr)0x0;
LAB_0011e11e:
  if (ptr != (byte *)0x0) {
    gdFree(ptr);
  }
  if (nnq != (nn_quant *)0x0) {
    gdFree(nnq);
  }
  return pgVar6;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageNeuQuant(gdImagePtr im, const int max_color, int sample_factor)
{
	const int newcolors = max_color;
	const int verbose = 1;

	int bot_idx, top_idx; /* for remapping of indices */
	int remap[MAXNETSIZE];
	int i,x;

	unsigned char map[MAXNETSIZE][4];
	unsigned char *d;

	nn_quant *nnq = NULL;

	int row;
	unsigned char *rgba = NULL;
	gdImagePtr dst = NULL;

	/* Default it to 3 */
	if (sample_factor < 1) {
		sample_factor = 3;
	}
	/* Start neuquant */
	/* Pierre:
	 * This implementation works with aligned contiguous buffer only
	 * Upcoming new buffers are contiguous and will be much faster.
	 * let don't bloat this code to support our good "old" 31bit format.
	 * It alos lets us convert palette image, if one likes to reduce
	 * a palette
	 */
	if (overflow2(gdImageSX(im), gdImageSY(im))
	        || overflow2(gdImageSX(im) * gdImageSY(im), 4)) {
		goto done;
	}
	rgba = (unsigned char *) gdMalloc(gdImageSX(im) * gdImageSY(im) * 4);
	if (!rgba) {
		goto done;
	}

	d = rgba;
	for (row = 0; row < gdImageSY(im); row++) {
		int *p = im->tpixels[row];
		register int c;

		for (i = 0; i < gdImageSX(im); i++) {
			c = *p;
			*d++ = gdImageAlpha(im, c);
			*d++ = gdImageRed(im, c);
			*d++ = gdImageBlue(im, c);
			*d++ = gdImageGreen(im, c);
			p++;
		}
	}

	nnq = (nn_quant *) gdMalloc(sizeof(nn_quant));
	if (!nnq) {
		goto done;
	}

	initnet(nnq, rgba, gdImageSY(im) * gdImageSX(im) * 4, sample_factor, newcolors);

	learn(nnq, verbose);
	unbiasnet(nnq);
	getcolormap(nnq, (unsigned char*)map);
	inxbuild(nnq);
	/* remapping colormap to eliminate opaque tRNS-chunk entries... */
	for (top_idx = newcolors-1, bot_idx = x = 0;  x < newcolors;  ++x) {
		if (map[x][3] == 255) { /* maxval */
			remap[x] = top_idx--;
		} else {
			remap[x] = bot_idx++;
		}
	}
	if (bot_idx != top_idx + 1) {
		gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n",
			 bot_idx, top_idx);
		goto done;
	}

	dst = gdImageCreate(gdImageSX(im), gdImageSY(im));
	if (!dst) {
		goto done;
	}

	for (x = 0; x < newcolors; ++x) {
		dst->red[remap[x]] = map[x][0];
		dst->green[remap[x]] = map[x][1];
		dst->blue[remap[x]] = map[x][2];
		dst->alpha[remap[x]] = map[x][3];
		dst->open[remap[x]] = 0;
		dst->colorsTotal++;
	}

	/* Do each image row */
	for ( row = 0; row < gdImageSY(im); ++row ) {
		int offset;
		unsigned char *p = dst->pixels[row];

		/* Assign the new colors */
		offset = row * gdImageSX(im) * 4;
		for(i=0; i < gdImageSX(im); i++) {
			p[i] = remap[
			           inxsearch(nnq, rgba[i * 4 + offset + ALPHA],
			                     rgba[i * 4 + offset + BLUE],
			                     rgba[i * 4 + offset + GREEN],
			                     rgba[i * 4 + offset + RED])
			       ];
		}
	}

done:
	if (rgba) {
		gdFree(rgba);
	}

	if (nnq) {
		gdFree(nnq);
	}
	return dst;
}